

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void my_canvas_vis_size(t_my_canvas *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  int local_2c;
  int i;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_my_canvas *x_local;
  
  tVar1 = atom_getfloatarg(0,ac,av);
  local_2c = (int)tVar1;
  if (local_2c < 1) {
    local_2c = 1;
  }
  x->x_vis_w = local_2c;
  if (1 < ac) {
    tVar1 = atom_getfloatarg(1,ac,av);
    local_2c = (int)tVar1;
    if (local_2c < 1) {
      local_2c = 1;
    }
  }
  x->x_vis_h = local_2c;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_vis_size(t_my_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int i;

    i = atom_getfloatarg(0, ac, av);
    if(i < 1)
        i = 1;
    x->x_vis_w = i;
    if(ac > 1)
    {
        i = atom_getfloatarg(1, ac, av);
        if(i < 1)
            i = 1;
    }
    x->x_vis_h = i;
    iemgui_size(x, &x->x_gui);
}